

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O3

void __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::TVirtualProtocol(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                   *this,shared_ptr<duckdb_apache::thrift::transport::TTransport> *ptrans)

{
  shared_ptr<duckdb_apache::thrift::transport::TTransport> local_18;
  
  local_18.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (ptrans->
           super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_18.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (ptrans->
       super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>)
       ._M_refcount._M_pi;
  if (local_18.
      super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.
       super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.
       super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  TProtocolDefaults::TProtocolDefaults(&this->super_TProtocolDefaults,&local_18);
  if (local_18.
      super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.
               super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (this->super_TProtocolDefaults).super_TProtocol._vptr_TProtocol =
       (_func_int **)&PTR__TProtocol_00499f88;
  return;
}

Assistant:

TVirtualProtocol(std::shared_ptr<TTransport> ptrans) : Super_(ptrans) {}